

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O0

Parser * Catch::Clara::operator|(Parser *p,ExeName *rhs)

{
  Parser *in_RDI;
  Parser *this;
  
  this = in_RDI;
  Parser::operator|=(in_RDI,(ExeName *)in_RDI);
  Parser::Parser(this,in_RDI);
  return this;
}

Assistant:

Parser operator|( Parser&& p, T&& rhs ) {
                p |= CATCH_FORWARD(rhs);
                return CATCH_MOVE(p);
            }